

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void h2v2_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  JSAMPARRAY in_RCX;
  long in_RDX;
  undefined1 *puVar3;
  long in_RDI;
  int outrow;
  int inrow;
  JSAMPROW outend;
  JSAMPLE invalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY output_data;
  int local_50;
  int local_4c;
  JDIMENSION in_stack_ffffffffffffffc4;
  JSAMPARRAY output_array;
  JSAMPROW pJVar4;
  
  pJVar4 = *in_RCX;
  local_4c = 0;
  for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x19c); local_50 = local_50 + 2) {
    puVar3 = *(undefined1 **)(pJVar4 + (long)local_50 * 8);
    puVar2 = puVar3 + *(uint *)(in_RDI + 0x88);
    output_array = *(JSAMPARRAY *)(in_RDX + (long)local_4c * 8);
    for (; puVar3 < puVar2; puVar3 = puVar3 + 2) {
      uVar1 = *(undefined1 *)output_array;
      in_stack_ffffffffffffffc4 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffc4);
      *puVar3 = uVar1;
      puVar3[1] = uVar1;
      output_array = (JSAMPARRAY)((long)output_array + 1);
    }
    jcopy_sample_rows(in_RCX,(int)((ulong)pJVar4 >> 0x20),output_array,(int)((ulong)puVar3 >> 0x20),
                      (int)puVar3,in_stack_ffffffffffffffc4);
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int inrow, outrow;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
    jcopy_sample_rows(output_data, outrow, output_data, outrow + 1, 1,
                      cinfo->output_width);
    inrow++;
    outrow += 2;
  }
}